

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessible.cpp
# Opt level: O0

Id __thiscall QAccessibleEvent::uniqueId(QAccessibleEvent *this)

{
  bool bVar1;
  int iVar2;
  QAccessibleInterface *pQVar3;
  undefined4 extraout_var;
  QDebug *o;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_RDI;
  long in_FS_OFFSET;
  QAccessibleInterface *iface;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *this_00;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Id IVar4;
  QDebug local_30;
  QDebug in_stack_ffffffffffffffd8;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  char *file;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI[1].category == (QLoggingCategory *)0x0) {
    IVar4 = *(Id *)&in_RDI[1].control;
  }
  else {
    this_00 = in_RDI;
    pQVar3 = QAccessible::queryAccessibleInterface((QObject *)iface);
    if (pQVar3 == (QAccessibleInterface *)0x0) {
      IVar4 = 0;
    }
    else {
      if (*(int *)&in_RDI[1].control != -1) {
        iVar2 = (*pQVar3->_vptr_QAccessibleInterface[9])(pQVar3,(ulong)*(uint *)&in_RDI[1].control);
        file = (char *)CONCAT44(extraout_var,iVar2);
        if (file == (char *)0x0) {
          local_18 = &DAT_aaaaaaaaaaaaaaaa;
          local_10 = &DAT_aaaaaaaaaaaaaaaa;
          lcAccessibilityCore();
          anon_unknown.dwarf_18373c9::QLoggingCategoryMacroHolder<(QtMsgType)1>::
          QLoggingCategoryMacroHolder
                    (in_RDI,(QLoggingCategory *)
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
            anon_unknown.dwarf_18373c9::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x957d3b);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)this_00,file,(int)((ulong)in_RDI >> 0x20),
                       (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (char *)0x957d51);
            QMessageLogger::warning();
            o = QDebug::operator<<((QDebug *)
                                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                   (char *)in_stack_ffffffffffffffd8.stream);
            QDebug::QDebug((QDebug *)&stack0xffffffffffffffd8,o);
            ::operator<<((Stream *)&local_20,(QObject *)&stack0xffffffffffffffd8);
            QDebug::operator<<((QDebug *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               (char *)in_stack_ffffffffffffffd8.stream);
            QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff8c);
            QDebug::~QDebug(&local_20);
            QDebug::~QDebug((QDebug *)&stack0xffffffffffffffd8);
            QDebug::~QDebug(&local_30);
            local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
          }
          IVar4 = 0;
          goto LAB_00957df9;
        }
      }
      IVar4 = QAccessible::uniqueId((QAccessibleInterface *)in_RDI);
    }
  }
LAB_00957df9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return IVar4;
}

Assistant:

QAccessible::Id QAccessibleEvent::uniqueId() const
{
    if (!m_object)
        return m_uniqueId;
    QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(m_object);
    if (!iface)
        return 0;
    if (m_child != -1) {
        iface = iface->child(m_child);
        if (Q_UNLIKELY(!iface)) {
            qCWarning(lcAccessibilityCore) << "Invalid child in QAccessibleEvent:" << m_object << "child:" << m_child;
            return 0;
        }
    }
    return QAccessible::uniqueId(iface);
}